

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tree.cpp
# Opt level: O0

int main(void)

{
  pointer this;
  pointer pSVar1;
  pointer this_00;
  unique_ptr<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_> local_b8;
  unique_ptr<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_> local_b0;
  unique_ptr<PrintArmNode,_std::default_delete<PrintArmNode>_> local_a8;
  unique_ptr<TBT::BehaviorNode<Arm_&>,_std::default_delete<TBT::BehaviorNode<Arm_&>_>_> local_a0;
  unique_ptr<TBT::PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>,_std::default_delete<TBT::PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>_>_>
  local_98;
  __single_object peelRightArm;
  unique_ptr<PrintArmNode,_std::default_delete<PrintArmNode>_> local_88;
  unique_ptr<TBT::BehaviorNode<Arm_&>,_std::default_delete<TBT::BehaviorNode<Arm_&>_>_> local_80;
  unique_ptr<TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>,_std::default_delete<TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>_>_>
  local_78;
  __single_object peelLeftArm;
  __single_object rootNode;
  BehaviorTree<Body_&> local_58;
  BehaviorTree<Body_&> tree;
  Body body;
  
  Body::Body((Body *)&tree);
  TBT::BehaviorTree<Body_&>::BehaviorTree(&local_58);
  std::make_unique<TBT::SequenceNode<Body&>>();
  std::make_unique<TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body&>,Arm&>>();
  this = std::
         unique_ptr<TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>,_std::default_delete<TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>_>_>
         ::operator->(&local_78);
  std::make_unique<PrintArmNode>();
  std::unique_ptr<TBT::BehaviorNode<Arm&>,std::default_delete<TBT::BehaviorNode<Arm&>>>::
  unique_ptr<PrintArmNode,std::default_delete<PrintArmNode>,void>
            ((unique_ptr<TBT::BehaviorNode<Arm&>,std::default_delete<TBT::BehaviorNode<Arm&>>> *)
             &local_80,&local_88);
  TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>::setChild(this,&local_80);
  std::unique_ptr<TBT::BehaviorNode<Arm_&>,_std::default_delete<TBT::BehaviorNode<Arm_&>_>_>::
  ~unique_ptr(&local_80);
  std::unique_ptr<PrintArmNode,_std::default_delete<PrintArmNode>_>::~unique_ptr(&local_88);
  pSVar1 = std::
           unique_ptr<TBT::SequenceNode<Body_&>,_std::default_delete<TBT::SequenceNode<Body_&>_>_>::
           operator->((unique_ptr<TBT::SequenceNode<Body_&>,_std::default_delete<TBT::SequenceNode<Body_&>_>_>
                       *)&peelLeftArm);
  std::unique_ptr<TBT::BehaviorNode<Body&>,std::default_delete<TBT::BehaviorNode<Body&>>>::
  unique_ptr<TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body&>,Arm&>,std::default_delete<TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body&>,Arm&>>,void>
            ((unique_ptr<TBT::BehaviorNode<Body&>,std::default_delete<TBT::BehaviorNode<Body&>>> *)
             &peelRightArm,&local_78);
  TBT::SequenceNode<Body_&>::addChild
            (pSVar1,(unique_ptr<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_>
                     *)&peelRightArm);
  std::unique_ptr<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_>::
  ~unique_ptr((unique_ptr<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_>
               *)&peelRightArm);
  std::make_unique<TBT::PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body&>,Arm&>>();
  this_00 = std::
            unique_ptr<TBT::PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>,_std::default_delete<TBT::PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>_>_>
            ::operator->(&local_98);
  std::make_unique<PrintArmNode>();
  std::unique_ptr<TBT::BehaviorNode<Arm&>,std::default_delete<TBT::BehaviorNode<Arm&>>>::
  unique_ptr<PrintArmNode,std::default_delete<PrintArmNode>,void>
            ((unique_ptr<TBT::BehaviorNode<Arm&>,std::default_delete<TBT::BehaviorNode<Arm&>>> *)
             &local_a0,&local_a8);
  TBT::PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>::setChild(this_00,&local_a0);
  std::unique_ptr<TBT::BehaviorNode<Arm_&>,_std::default_delete<TBT::BehaviorNode<Arm_&>_>_>::
  ~unique_ptr(&local_a0);
  std::unique_ptr<PrintArmNode,_std::default_delete<PrintArmNode>_>::~unique_ptr(&local_a8);
  pSVar1 = std::
           unique_ptr<TBT::SequenceNode<Body_&>,_std::default_delete<TBT::SequenceNode<Body_&>_>_>::
           operator->((unique_ptr<TBT::SequenceNode<Body_&>,_std::default_delete<TBT::SequenceNode<Body_&>_>_>
                       *)&peelLeftArm);
  std::unique_ptr<TBT::BehaviorNode<Body&>,std::default_delete<TBT::BehaviorNode<Body&>>>::
  unique_ptr<TBT::PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body&>,Arm&>,std::default_delete<TBT::PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body&>,Arm&>>,void>
            ((unique_ptr<TBT::BehaviorNode<Body&>,std::default_delete<TBT::BehaviorNode<Body&>>> *)
             &local_b0,&local_98);
  TBT::SequenceNode<Body_&>::addChild(pSVar1,&local_b0);
  std::unique_ptr<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_>::
  ~unique_ptr(&local_b0);
  std::unique_ptr<TBT::BehaviorNode<Body&>,std::default_delete<TBT::BehaviorNode<Body&>>>::
  unique_ptr<TBT::SequenceNode<Body&>,std::default_delete<TBT::SequenceNode<Body&>>,void>
            ((unique_ptr<TBT::BehaviorNode<Body&>,std::default_delete<TBT::BehaviorNode<Body&>>> *)
             &local_b8,
             (unique_ptr<TBT::SequenceNode<Body_&>,_std::default_delete<TBT::SequenceNode<Body_&>_>_>
              *)&peelLeftArm);
  TBT::BehaviorTree<Body_&>::setRoot(&local_58,&local_b8);
  std::unique_ptr<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_>::
  ~unique_ptr(&local_b8);
  TBT::BehaviorTree<Body_&>::tickRoot(&local_58,(Body *)&tree);
  std::
  unique_ptr<TBT::PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>,_std::default_delete<TBT::PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>_>_>
  ::~unique_ptr(&local_98);
  std::
  unique_ptr<TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>,_std::default_delete<TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>_>_>
  ::~unique_ptr(&local_78);
  std::unique_ptr<TBT::SequenceNode<Body_&>,_std::default_delete<TBT::SequenceNode<Body_&>_>_>::
  ~unique_ptr((unique_ptr<TBT::SequenceNode<Body_&>,_std::default_delete<TBT::SequenceNode<Body_&>_>_>
               *)&peelLeftArm);
  TBT::BehaviorTree<Body_&>::~BehaviorTree(&local_58);
  Body::~Body((Body *)&tree);
  return 0;
}

Assistant:

int main()
{
    Body body;


    BehaviorTree<Body&> tree;

    auto rootNode = std::make_unique<SequenceNode<Body&>>();
    auto peelLeftArm = std::make_unique<PeelLeftArm>();
    peelLeftArm->setChild(std::make_unique<PrintArmNode>());
    rootNode->addChild(std::move(peelLeftArm));
    auto peelRightArm = std::make_unique<PeelRightArm>();
    peelRightArm->setChild(std::make_unique<PrintArmNode>());
    rootNode->addChild(std::move(peelRightArm));

    tree.setRoot(std::move(rootNode));

    tree.tickRoot(body);

    return 0;
}